

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O0

expected<idx2::brick_volume,_idx2::idx2_err_code> *
idx2::DecodeTask(expected<idx2::brick_volume,_idx2::idx2_err_code> *__return_storage_ptr__,
                idx2_file *Idx2,params *P,decode_data *D,decode_state Ds,grid OutGrid,f64 Tolerance,
                mmap_volume *OutVol,volume *OutVolMem)

{
  decode_state Ds_00;
  undefined4 uVar1;
  undefined8 uVar2;
  u64 uVar3;
  grid *Grid2;
  brick_volume *pbVar4;
  code *local_4e8;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_4e0;
  iterator local_458;
  undefined1 local_438 [8];
  unique_lock<std::mutex> Lock_1;
  u64 BrickKey_1;
  undefined1 local_400 [8];
  unique_lock<std::mutex> Lock;
  u64 BrickKey;
  code *local_3d0;
  _func_void_grid_ptr_volume_ptr_grid_ptr_volume_ptr *CopyFunc;
  volume *OutputVol;
  grid BrickGridLocal;
  grid OutBrickGrid;
  uint local_388;
  uint local_384;
  undefined8 local_36c;
  uint local_364;
  undefined1 local_360 [8];
  grid BrickGrid;
  brick_volume *BVol;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 uStack_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined1 local_2d0 [8];
  expected<idx2::brick_volume,_idx2::idx2_err_code> Result;
  undefined8 local_260;
  int local_258;
  undefined8 local_254;
  v3i B3;
  volume *OutVolMem_local;
  mmap_volume *OutVol_local;
  f64 Tolerance_local;
  decode_data *D_local;
  params *P_local;
  idx2_file *Idx2_local;
  undefined8 local_1ec;
  ulong local_1e0;
  int local_1d8;
  undefined8 *local_1d0;
  v3i *local_1c8;
  undefined8 local_1bc;
  undefined8 local_1b0;
  int local_1a8;
  int local_180;
  int local_17c;
  int I;
  undefined8 local_16c;
  v3i Result_1;
  undefined8 local_13c;
  undefined1 *local_130;
  undefined1 *local_128;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *local_120;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  int local_fc;
  stack_array<unsigned_char,_16> *local_f8;
  undefined4 local_ec;
  undefined8 *local_e8;
  uint local_dc;
  undefined1 *local_d8;
  undefined1 *local_d0;
  v3i *local_c8;
  undefined8 *local_c0;
  undefined1 *local_b8;
  u64 local_b0;
  i8 local_a1;
  u64 local_a0;
  i8 local_91;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *local_90;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *local_88;
  v3i *local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 *local_40;
  uint local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  v3i *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  
  uVar1 = Ds._92_4_;
  local_1c8 = &Idx2->BrickDims3;
  _I = &Idx2->GroupBrick3;
  local_17c = (int)Ds.Level;
  local_e8 = &local_16c;
  local_ec = 1;
  local_16c._0_4_ = 1;
  local_16c._4_4_ = 1;
  Result_1.field_0.field_0.X = 1;
  local_180 = 0;
  while( true ) {
    if (local_17c <= local_180) break;
    local_5c = (int)local_16c * (_I->field_0).field_0.X;
    local_60 = local_16c._4_4_ * (Idx2->GroupBrick3).field_0.field_0.Y;
    Result_1.field_0.field_0.X = Result_1.field_0.field_0.X * (Idx2->GroupBrick3).field_0.field_0.Z;
    local_58 = &local_13c;
    local_13c._0_4_ = local_5c;
    local_13c._4_4_ = local_60;
    local_16c = local_13c;
    local_180 = local_180 + 1;
    local_64 = Result_1.field_0.field_0.X;
  }
  local_1a8 = Result_1.field_0.field_0.X;
  local_1b0 = local_16c;
  local_258 = Result_1.field_0.field_0.X;
  local_260 = local_16c;
  local_1d0 = &local_260;
  pbVar4 = (brick_volume *)(ulong)local_16c._4_4_;
  local_44 = (local_1c8->field_0).field_0.X * (int)local_16c;
  local_48 = (Idx2->BrickDims3).field_0.field_0.Y * local_16c._4_4_;
  B3.field_0.field_0.X = (Idx2->BrickDims3).field_0.field_0.Z * Result_1.field_0.field_0.X;
  local_40 = &local_1bc;
  local_1bc._0_4_ = local_44;
  local_1bc._4_4_ = local_48;
  local_1e0 = local_1bc;
  Result._72_8_ = local_1bc;
  local_254 = local_1bc;
  Ds._92_4_ = uVar1;
  B3.field_0.field_4.YZ.field_0 = (v2<int>)OutVolMem;
  local_1d8 = B3.field_0.field_0.X;
  local_4c = B3.field_0.field_0.X;
  memcpy(&local_330,&Ds,0x60);
  Ds_00.ParentBrick.Vol.Buffer.Bytes = uStack_328;
  Ds_00.ParentBrick.Vol.Buffer.Data = (byte *)local_330;
  Ds_00.ParentBrick.Vol.Buffer.Alloc = (allocator *)uStack_320;
  Ds_00.ParentBrick.Vol.Dims = uStack_318;
  Ds_00.ParentBrick.Vol._32_8_ = local_310;
  Ds_00.ParentBrick.ExtentLocal.From = uStack_308;
  Ds_00.ParentBrick.ExtentLocal.Dims = uStack_300;
  Ds_00.ParentBrick.NChildrenDecoded = (undefined1)uStack_2f8;
  Ds_00.ParentBrick.NChildrenMax = uStack_2f8._1_1_;
  Ds_00.ParentBrick.Significant = (bool)uStack_2f8._2_1_;
  Ds_00.ParentBrick.DoneDecoding = (bool)uStack_2f8._3_1_;
  Ds_00.ParentBrick._60_4_ = uStack_2f8._4_4_;
  Ds_00.Brick3.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)local_2f0;
  Ds_00._72_8_ = uStack_2e8;
  Ds_00.Brick = uStack_2e0;
  Ds_00.BrickInChunk = (undefined4)uStack_2d8;
  Ds_00.Level = uStack_2d8._4_1_;
  Ds_00.Subband = uStack_2d8._5_1_;
  Ds_00._94_2_ = uStack_2d8._6_2_;
  ParallelDecodeBrick((expected<idx2::brick_volume,_idx2::idx2_err_code> *)local_2d0,Idx2,P,D,Ds_00,
                      Tolerance);
  local_130 = local_2d0;
  if ((Result.field_1.Val.NChildrenDecoded & 1U) == 0) {
    local_128 = local_2d0;
    local_120 = &Result;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffb00;
    (__return_storage_ptr__->field_1).Val.Vol.Buffer.Data = (byte *)Result._vptr_expected;
    (__return_storage_ptr__->field_1).Val.Vol.Buffer.Bytes = (i64)Result.field_1.Val.Vol.Buffer.Data
    ;
    __return_storage_ptr__->Ok = false;
    local_118 = __return_storage_ptr__;
    goto LAB_0024a1d2;
  }
  local_108 = local_2d0;
  BrickGrid.Strd = (u64)&Result;
  if (Ds.Level == '\0') {
LAB_00249ba5:
    pbVar4 = (brick_volume *)(local_254 & 0xffffffff);
    local_2c = Ds.Brick3.field_0.field_0.X * (int)local_254;
    local_30 = Ds.Brick3.field_0.field_0.Y * local_254._4_4_;
    local_364 = Ds.Brick3.field_0.field_0.Z * B3.field_0.field_0.X;
    local_28 = &local_1ec;
    local_1ec._0_4_ = local_2c;
    local_1ec._4_4_ = local_30;
    local_36c = local_1ec;
    uVar2 = local_36c;
    local_c8 = &Idx2->BrickDims3;
    local_dc = 1 << (Ds.Level & 0x1fU);
    local_d8 = (undefined1 *)((long)&OutBrickGrid.Strd + 4);
    local_b8 = local_360;
    local_c0 = &local_36c;
    local_d0 = (undefined1 *)((long)&OutBrickGrid.Strd + 4);
    local_36c._0_4_ = (uint)local_1ec;
    local_36c._4_4_ = (uint)((ulong)local_1ec >> 0x20);
    local_360 = (undefined1  [8])
                ((long)(int)((uint)local_36c & 0x1fffff) +
                 (long)(int)(local_36c._4_4_ & 0x1fffff) * 0x200000 +
                ((long)(int)(local_364 & 0x1fffff) << 0x2a));
    BrickGrid.super_extent.From =
         (long)(int)((local_c8->field_0).field_0.X & 0x1fffff) +
         (long)(int)((Idx2->BrickDims3).field_0.field_0.Y & 0x1fffff) * 0x200000 +
         ((long)(int)((Idx2->BrickDims3).field_0.field_0.Z & 0x1fffff) << 0x2a);
    Grid2 = (grid *)((long)(int)(OutBrickGrid.Strd._4_4_ & 0x1fffff) +
                     (long)(int)(local_388 & 0x1fffff) * 0x200000 +
                    ((long)(int)(local_384 & 0x1fffff) << 0x2a));
    local_36c = uVar2;
    local_80 = local_c8;
    local_78 = local_c0;
    local_70 = local_b8;
    local_34 = local_364;
    local_20 = local_c8;
    local_18 = local_c0;
    local_10 = local_d0;
    OutBrickGrid.Strd._4_4_ = local_dc;
    BrickGrid.super_extent.Dims = (u64)Grid2;
    Crop<idx2::grid,idx2::grid>
              ((grid *)&BrickGridLocal.Strd,(idx2 *)&OutGrid,(grid *)local_360,Grid2);
    Relative<idx2::grid,idx2::grid>
              ((grid *)&OutputVol,(idx2 *)&BrickGridLocal.Strd,(grid *)local_360,Grid2);
    uVar3 = BrickGrid.Strd;
    if ((P->OutMode == RegularGridFile) || (P->OutMode == RegularGridMem)) {
      local_4e0 = (anon_union_8_4_6ba14846_for_v2<int>_1)OutVol;
      if (P->OutMode != RegularGridFile) {
        local_4e0 = (anon_union_8_4_6ba14846_for_v2<int>_1)B3.field_0.field_4.YZ.field_0;
      }
      CopyFunc = (_func_void_grid_ptr_volume_ptr_grid_ptr_volume_ptr *)local_4e0;
      if (*(dtype *)((long)local_4e0 + 0x20) == float32) {
        local_4e8 = CopyGridGrid<double,float>;
      }
      else {
        local_4e8 = CopyGridGrid<double,double>;
      }
      local_3d0 = local_4e8;
      Relative<idx2::grid,idx2::grid>((grid *)&BrickKey,(idx2 *)&BrickGridLocal.Strd,&OutGrid,Grid2)
      ;
      (*local_4e8)(&OutputVol,uVar3,&BrickKey,CopyFunc);
      Dealloc((brick_volume *)BrickGrid.Strd);
    }
    else if (P->OutMode == HashMap) {
      if ((*(byte *)(BrickGrid.Strd + 0x3a) & 1) == 0) {
        Dealloc((brick_volume *)BrickGrid.Strd);
      }
      else {
        local_91 = Ds.Level;
        local_a0 = Ds.Brick;
        Lock._8_8_ = Ds.Brick * 0x10 + (long)Ds.Level;
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)local_400,&D->BrickPoolMutex);
        Insert<unsigned_long,idx2::brick_volume>
                  ((iterator *)&BrickKey_1,(idx2 *)&D->BrickPool,
                   (hash_table<unsigned_long,_idx2::brick_volume> *)&Lock._M_owns,
                   (unsigned_long *)BrickGrid.Strd,pbVar4);
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_400);
      }
    }
    else if (P->OutMode == NoOutput) {
      Dealloc((brick_volume *)BrickGrid.Strd);
    }
  }
  else {
    local_f8 = &Idx2->DecodeSubbandMasks;
    local_fc = Ds.Level + -1;
    if (0xf < local_fc) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]"
                   );
    }
    if (local_f8->Arr[local_fc] == '\0') goto LAB_00249ba5;
    if ((P->OutMode == HashMap) && ((Result.field_1.Val.ExtentLocal.Dims._2_1_ & 1) != 0)) {
      local_a1 = Ds.Level;
      local_b0 = Ds.Brick;
      Lock_1._8_8_ = Ds.Brick * 0x10 + (long)Ds.Level;
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)local_438,&D->BrickPoolMutex);
      Insert<unsigned_long,idx2::brick_volume>
                (&local_458,(idx2 *)&D->BrickPool,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)&Lock_1._M_owns,
                 (unsigned_long *)BrickGrid.Strd,pbVar4);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_438);
    }
  }
  local_110 = local_2d0;
  local_90 = &Result;
  __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffb00;
  local_88 = __return_storage_ptr__;
  memcpy(&__return_storage_ptr__->field_1,local_90,0x40);
  __return_storage_ptr__->Ok = true;
LAB_0024a1d2:
  expected<idx2::brick_volume,_idx2::idx2_err_code>::~expected
            ((expected<idx2::brick_volume,_idx2::idx2_err_code> *)local_2d0);
  return __return_storage_ptr__;
}

Assistant:

expected<brick_volume, idx2_err_code>
DecodeTask(const idx2_file& Idx2,
           const params& P,
           decode_data* D,
           decode_state Ds,
           grid OutGrid,
           f64 Tolerance,
           mmap_volume* OutVol,
           volume* OutVolMem)
{
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Ds.Level);
  /* --------------- Decode the brick --------------- */
  auto Result = ParallelDecodeBrick(Idx2, P, D, Ds, Tolerance);
  if (!Result)
    return Error(Result);
  // Copy the samples out to the output buffer (or file)
  // The Idx2.DecodeSubbandMasks[Level - 1] == 0 means that no subbands on the next level
  // will be decoded, so we can now just copy the result out
  brick_volume& BVol = Value(Result);
  if (Ds.Level == 0 || Idx2.DecodeSubbandMasks[Ds.Level - 1] == 0)
  {
    grid BrickGrid(Ds.Brick3 * B3, Idx2.BrickDims3, v3i(1 << Ds.Level));
    grid OutBrickGrid = Crop(OutGrid, BrickGrid);
    grid BrickGridLocal = Relative(OutBrickGrid, BrickGrid);
    if (P.OutMode == params::out_mode::RegularGridFile ||
        P.OutMode == params::out_mode::RegularGridMem)
    {
      auto OutputVol =
        P.OutMode == params::out_mode::RegularGridFile ? &OutVol->Vol : OutVolMem;
      auto CopyFunc = OutputVol->Type == dtype::float32 ? (CopyGridGrid<f64, f32>)
                                                        : (CopyGridGrid<f64, f64>);
      CopyFunc(BrickGridLocal, BVol.Vol, Relative(OutBrickGrid, OutGrid), OutputVol);
      Dealloc(&BVol); // TODO: dealloc here or outside?
    }
    else if (P.OutMode == params::out_mode::HashMap)
    {
      if (!BVol.Significant)
      {
        Dealloc(&BVol);
      }
      else
      {
        u64 BrickKey = GetBrickKey(Ds.Level, Ds.Brick);
        std::unique_lock<std::mutex> Lock(D->BrickPoolMutex);
        Insert(&D->BrickPool.BrickTable, BrickKey, BVol);
      }
    }
    else if (P.OutMode == params::out_mode::NoOutput)
    {
      Dealloc(&BVol);
    }
  }
  else // not the finest level
  {
    if (P.OutMode == params::out_mode::HashMap)
    {
      if (BVol.Significant)
      {
        u64 BrickKey = GetBrickKey(Ds.Level, Ds.Brick);
        std::unique_lock<std::mutex> Lock(D->BrickPoolMutex);
        Insert(&D->BrickPool.BrickTable, BrickKey, BVol);
      }
    }
  }

  return Value(Result);
}